

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O3

Variant * __thiscall
Jinx::Impl::Script::GetVariable(Variant *__return_storage_ptr__,Script *this,RuntimeID id)

{
  pointer pVVar1;
  pointer pIVar2;
  pointer pIVar3;
  
  pIVar2 = (this->m_idIndexData).
           super__Vector_base<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    pIVar3 = pIVar2;
    if (pIVar3 == (this->m_idIndexData).
                  super__Vector_base<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>
                  ._M_impl.super__Vector_impl_data._M_start) goto LAB_001f459b;
    pIVar2 = pIVar3 + -1;
  } while (pIVar3[-1].id != id);
  pVVar1 = (this->m_stack).
           super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pIVar3[-1].index <
      (ulong)(((long)(this->m_stack).
                     super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 3) *
             -0x3333333333333333)) {
    Variant::Copy(__return_storage_ptr__,pVVar1 + pIVar3[-1].index);
  }
  else {
    LogWriteLine(Error,"Attempted to access stack at invalid index");
LAB_001f459b:
    __return_storage_ptr__->m_type = Null;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Variant Script::GetVariable(RuntimeID id) const
	{
		for (auto ritr = m_idIndexData.rbegin(); ritr != m_idIndexData.rend(); ++ritr)
		{
			if (ritr->id == id)
			{
				if (ritr->index >= m_stack.size())
				{
					LogWriteLine(LogLevel::Error, "Attempted to access stack at invalid index");
					return Variant();
				}
				return m_stack[ritr->index];
			}
		}
		return Variant();
	}